

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

RawHeadersList * __thiscall QNetworkHeadersPrivate::allRawHeaders(QNetworkHeadersPrivate *this)

{
  Data *pDVar1;
  pair<QByteArray,_QByteArray> *ppVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> local_58;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->rawHeaderCache).isCached == false) {
    fromHttpToRaw((RawHeadersList *)&local_58,&this->httpHeaders);
    qVar3 = local_58.size;
    ppVar2 = local_58.ptr;
    pDVar1 = local_58.d;
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (pair<QByteArray,_QByteArray> *)0x0;
    local_38.d = (this->rawHeaderCache).headersList.d.d;
    local_38.ptr = (this->rawHeaderCache).headersList.d.ptr;
    (this->rawHeaderCache).headersList.d.d = pDVar1;
    (this->rawHeaderCache).headersList.d.ptr = ppVar2;
    local_38.size = (this->rawHeaderCache).headersList.d.size;
    (this->rawHeaderCache).headersList.d.size = qVar3;
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer(&local_58);
    (this->rawHeaderCache).isCached = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (RawHeadersList *)this;
  }
  __stack_chk_fail();
}

Assistant:

const QNetworkHeadersPrivate::RawHeadersList &QNetworkHeadersPrivate::allRawHeaders() const
{
    if (rawHeaderCache.isCached)
        return rawHeaderCache.headersList;

    rawHeaderCache.headersList = fromHttpToRaw(httpHeaders);
    rawHeaderCache.isCached = true;
    return rawHeaderCache.headersList;
}